

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::predict_or_learn_cover<true>(cb_explore *data,single_learner *base,example *ec)

{
  label *this;
  label *ld;
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  learner<CB_EXPLORE::cb_explore,_example> *plVar5;
  float *pfVar6;
  label_t lVar7;
  size_t sVar8;
  wclass *pwVar9;
  wclass *pwVar10;
  long lVar11;
  cb_class *pcVar12;
  ulong uVar13;
  uint32_t uVar14;
  uint uVar15;
  wclass *pwVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined4 in_XMM3_Db;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  action_scores probs;
  wclass local_68;
  v_array<ACTION_SCORE::action_score> local_58;
  undefined1 auVar22 [16];
  
  uVar15 = (data->cbcs).num_actions;
  uVar19 = (ulong)uVar15;
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  pwVar16 = (wclass *)base;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  this = &data->cs_label;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  if (uVar19 != 0) {
    uVar14 = 1;
    do {
      local_68.x = 3.4028235e+38;
      local_68.partial_prediction = 0.0;
      local_68.wap_value = 0.0;
      pwVar16 = &local_68;
      local_68.class_index = uVar14;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_68);
      iVar18 = (1 - uVar15) + uVar14;
      uVar14 = uVar14 + 1;
    } while (iVar18 != 1);
  }
  uVar4 = data->cover_size;
  lVar11 = data->counter * uVar19;
  auVar24._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar24._0_8_ = lVar11;
  auVar24._12_4_ = 0x45300000;
  dVar20 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  ld = &data->cb_label;
  lVar7 = (ec->l).multi;
  pcVar12 = (cb_class *)(ec->l).cs.costs._end;
  sVar8 = (ec->l).cs.costs.erase_count;
  (data->cb_label).costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  (data->cb_label).costs.erase_count = sVar8;
  (data->cb_label).costs._begin = (cb_class *)lVar7;
  (data->cb_label).costs._end = pcVar12;
  pwVar9 = (data->cs_label).costs._end;
  pwVar10 = (data->cs_label).costs.end_array;
  sVar8 = (data->cs_label).costs.erase_count;
  (ec->l).multi = (label_t)(this->costs)._begin;
  (ec->l).cs.costs._end = pwVar9;
  (ec->l).cs.costs.end_array = pwVar10;
  (ec->l).cs.costs.erase_count = sVar8;
  get_cover_probabilities(data,(single_learner *)pwVar16,ec,&local_58);
  lVar7 = (label_t)(data->cb_label).costs._begin;
  pcVar12 = (data->cb_label).costs._end;
  sVar8 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar8;
  (ec->l).multi = lVar7;
  (ec->l).cs.costs._end = (wclass *)pcVar12;
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  lVar7 = (label_t)(data->cb_label).costs._begin;
  pcVar12 = (data->cb_label).costs._end;
  sVar8 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar8;
  (ec->l).multi = lVar7;
  (ec->l).cs.costs._end = (wclass *)pcVar12;
  pcVar12 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar12;
  GEN_CS::gen_cs_example<false>(&data->cbcs,ec,ld,this);
  if (uVar19 != 0) {
    uVar13 = 0;
    do {
      (data->cover_probs)._begin[uVar13] = 0.0;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  lVar7 = (label_t)(data->second_cs_label).costs._begin;
  pwVar16 = (data->second_cs_label).costs._end;
  sVar8 = (data->second_cs_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (data->second_cs_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar8;
  (ec->l).multi = lVar7;
  (ec->l).cs.costs._end = pwVar16;
  if (uVar4 != 0) {
    auVar21._0_4_ = (float)dVar20;
    auVar22._4_8_ = 0;
    auVar22._0_4_ = auVar21._0_4_;
    auVar22._12_4_ = in_XMM3_Db;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._4_4_ = (float)uVar19;
    auVar28 = divps(_DAT_00293230,auVar21);
    if (auVar28._4_4_ <= auVar28._0_4_) {
      auVar28._4_12_ = auVar28._4_12_;
      auVar28._0_4_ = auVar28._4_4_;
    }
    fVar29 = 1.0 / (float)uVar4;
    fVar27 = auVar28._0_4_;
    fVar26 = (float)uVar19 * fVar27;
    uVar13 = 0;
    do {
      if (uVar19 != 0) {
        uVar14 = 1;
        lVar11 = 0;
        do {
          fVar2 = (&((data->cs_label).costs._begin)->x)[lVar11];
          fVar23 = data->psi;
          fVar3 = *(float *)((long)(data->cover_probs)._begin + lVar11);
          fVar25 = fVar27;
          if (fVar27 <= fVar3) {
            fVar25 = fVar3;
          }
          (&((data->second_cs_label).costs._begin)->class_index)[lVar11] = uVar14;
          (&((data->second_cs_label).costs._begin)->x)[lVar11] =
               (fVar2 - (fVar23 * fVar27) / (fVar25 / fVar26)) + 1.0;
          lVar11 = lVar11 + 4;
          uVar14 = uVar14 + 1;
        } while (uVar19 * 4 - lVar11 != 0);
      }
      if (uVar13 != 0) {
        plVar5 = data->cs;
        iVar18 = (int)uVar13 + 1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(plVar5 + 0xe0) * iVar18);
        (**(code **)(plVar5 + 0x28))
                  (*(undefined8 *)(plVar5 + 0x18),*(undefined8 *)(plVar5 + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar18 * *(int *)(plVar5 + 0xe0));
      }
      pfVar6 = (data->cover_probs)._begin;
      uVar15 = (data->preds)._begin[uVar13] - 1;
      fVar2 = pfVar6[uVar15];
      fVar23 = (fVar2 - fVar27) + fVar29;
      uVar17 = (ulong)fVar23;
      fVar26 = fVar26 + (float)(~-(uint)(fVar2 < fVar27) & (uint)fVar29 |
                               (uint)(float)((long)(fVar23 - 9.223372e+18) & (long)uVar17 >> 0x3f |
                                            uVar17) & -(uint)(fVar2 < fVar27));
      pfVar6[uVar15] = fVar29 + fVar2;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar4);
  }
  lVar7 = (label_t)(ld->costs)._begin;
  pcVar12 = (data->cb_label).costs._end;
  sVar8 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar8;
  (ec->l).multi = lVar7;
  (ec->l).cs.costs._end = (wclass *)pcVar12;
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = (float *)local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}